

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
::~Parser(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
          *this)

{
  MapEntryImpl<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  *pMVar1;
  ulong uVar2;
  undefined8 *puVar3;
  
  pMVar1 = this->entry_;
  if (pMVar1 != (MapEntryImpl<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                 *)0x0) {
    uVar2 = (pMVar1->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 == (undefined8 *)0x0) {
      (*(pMVar1->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  std::__cxx11::string::~string((string *)&this->key_);
  return;
}

Assistant:

~Parser() {
      if (entry_ != nullptr && entry_->GetArenaForAllocation() == nullptr)
        delete entry_;
    }